

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationRuleParser::parseString
          (CollationRuleParser *this,int32_t i,UnicodeString *raw,UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  CollationRuleParser *this_00;
  UBool UVar4;
  ushort uVar5;
  int32_t iVar6;
  int iVar7;
  UnicodeString *pUVar8;
  char16_t *pcVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  char16_t cVar13;
  uint uVar14;
  uint uVar15;
  uint local_50;
  char16_t local_4a;
  CollationRuleParser *local_48;
  UChar local_3c;
  char16_t local_3a;
  long local_38;
  
  uVar10 = i;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (raw->fUnion).fStackFields.fLengthAndFlags;
    uVar5 = 2;
    if ((uVar1 & 1) == 0) {
      uVar5 = uVar1 & 0x1e;
    }
    (raw->fUnion).fStackFields.fLengthAndFlags = uVar5;
    pUVar8 = this->rules;
    sVar2 = (pUVar8->fUnion).fStackFields.fLengthAndFlags;
    uVar10 = (uint)sVar2;
    if (sVar2 < 0) {
      uVar11 = (pUVar8->fUnion).fFields.fLength;
    }
    else {
      uVar11 = (int)uVar10 >> 5;
    }
    if (i < (int)uVar11) {
      local_38 = 2;
      local_48 = this;
      do {
        this_00 = local_48;
        cVar13 = L'\xffff';
        if ((uint)i < uVar11) {
          if ((uVar10 & 2) == 0) {
            pcVar9 = (pUVar8->fUnion).fFields.fArray;
          }
          else {
            pcVar9 = (char16_t *)((long)&pUVar8->fUnion + 2);
          }
          cVar13 = pcVar9[i];
        }
        uVar15 = i + 1;
        if (0x5d < (ushort)cVar13 - 0x21) {
LAB_0023f957:
          UVar4 = PatternProps::isWhiteSpace((uint)(ushort)cVar13);
          if (UVar4 == '\0') {
            lVar12 = 0;
            local_3a = cVar13;
            UnicodeString::doAppend(raw,&local_3a,0,1);
          }
          else {
LAB_0023f967:
            lVar12 = 3;
          }
          goto LAB_0023f98f;
        }
        if ((ushort)cVar13 < 0x30) {
LAB_0023f6e1:
          if (cVar13 != L'\\') {
            if ((ushort)cVar13 != 0x27) goto LAB_0023f967;
            if (uVar15 < uVar11 && (int)uVar15 < (int)uVar11) {
              if ((uVar10 & 2) == 0) {
                pcVar9 = (pUVar8->fUnion).fFields.fArray;
              }
              else {
                pcVar9 = (char16_t *)((long)&pUVar8->fUnion + 2);
              }
              if (pcVar9[(int)uVar15] == L'\'') {
                local_3c = L'\'';
                UnicodeString::doAppend(raw,&local_3c,0,1);
                iVar6 = (*(code *)((long)&DAT_00301390 + (long)(int)(&DAT_00301390)[local_38]))();
                return iVar6;
              }
            }
            pUVar8 = local_48->rules;
            sVar2 = (pUVar8->fUnion).fStackFields.fLengthAndFlags;
            uVar10 = (uint)sVar2;
            if (sVar2 < 0) {
              uVar11 = (pUVar8->fUnion).fFields.fLength;
            }
            else {
              uVar11 = (int)uVar10 >> 5;
            }
            goto LAB_0023f811;
          }
        }
        else {
          uVar14 = (ushort)cVar13 - 0x3a;
          if (0x26 < uVar14) {
LAB_0023f94d:
            if ((ushort)cVar13 < 0x7b) goto LAB_0023f957;
            goto LAB_0023f6e1;
          }
          if ((0x7a0000007fU >> ((ulong)uVar14 & 0x3f) & 1) != 0) goto LAB_0023f967;
          if ((ulong)uVar14 != 0x22) goto LAB_0023f94d;
        }
        if (uVar15 == uVar11) {
          lVar12 = 1;
          if (U_ZERO_ERROR < *errorCode) goto LAB_0023f98f;
          *errorCode = U_INVALID_FORMAT_ERROR;
          local_48->errorReason = "backslash escape at the end of the rule string";
          if (local_48->parseError != (UParseError *)0x0) {
            setErrorContext(local_48);
            return uVar15;
          }
          goto LAB_0023f8be;
        }
        uVar10 = UnicodeString::char32At(pUVar8,uVar15);
        UnicodeString::append(raw,uVar10);
        i = (uVar15 - (uVar10 < 0x10000)) + 2;
        pUVar8 = local_48->rules;
        sVar2 = (pUVar8->fUnion).fStackFields.fLengthAndFlags;
        uVar10 = (uint)sVar2;
        if (sVar2 < 0) {
          uVar11 = (pUVar8->fUnion).fFields.fLength;
        }
        else {
          uVar11 = (int)uVar10 >> 5;
        }
        this = local_48;
      } while (i < (int)uVar11);
    }
    iVar6 = 0;
    do {
      sVar2 = (raw->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar7 = (raw->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)sVar2 >> 5;
      }
      if (iVar7 <= iVar6) {
        return i;
      }
      uVar10 = UnicodeString::char32At(raw,iVar6);
      if ((uVar10 & 0xfffff800) == 0xd800) {
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          this->errorReason = "string contains an unpaired surrogate";
LAB_0023fa42:
          if (this->parseError != (UParseError *)0x0) {
            setErrorContext(this);
          }
        }
LAB_0023fa51:
        bVar3 = false;
        local_50 = i;
      }
      else {
        if (uVar10 - 0xfffd < 3) {
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            this->errorReason = "string contains U+FFFD, U+FFFE or U+FFFF";
            goto LAB_0023fa42;
          }
          goto LAB_0023fa51;
        }
        iVar6 = (iVar6 - (uint)(uVar10 < 0x10000)) + 2;
        bVar3 = true;
      }
      uVar10 = local_50;
    } while (bVar3);
  }
  local_50 = uVar10;
  return local_50;
LAB_0023f811:
  if (uVar15 == uVar11) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      this_00->errorReason = "quoted literal text missing terminating apostrophe";
      if (this_00->parseError != (UParseError *)0x0) {
        setErrorContext(this_00);
        return uVar15;
      }
    }
LAB_0023f8be:
    lVar12 = 1;
LAB_0023f98f:
    iVar6 = (*(code *)((long)&DAT_00301390 + (long)(int)(&DAT_00301390)[lVar12]))();
    return iVar6;
  }
  cVar13 = L'\xffff';
  if (uVar15 < uVar11) {
    if ((uVar10 & 2) == 0) {
      pcVar9 = (pUVar8->fUnion).fFields.fArray;
    }
    else {
      pcVar9 = (char16_t *)((long)&pUVar8->fUnion + 2);
    }
    cVar13 = pcVar9[(int)uVar15];
  }
  uVar14 = uVar15 + 1;
  if (cVar13 == L'\'') {
    lVar12 = 0;
    if (uVar11 <= uVar14 || (int)uVar11 <= (int)uVar14) goto LAB_0023f98f;
    if ((uVar10 & 2) == 0) {
      pcVar9 = (pUVar8->fUnion).fFields.fArray;
    }
    else {
      pcVar9 = (char16_t *)((long)&pUVar8->fUnion + 2);
    }
    if (pcVar9[(int)uVar14] != L'\'') goto LAB_0023f98f;
    uVar14 = uVar15 + 2;
  }
  local_4a = cVar13;
  UnicodeString::doAppend(raw,&local_4a,0,1);
  pUVar8 = this_00->rules;
  sVar2 = (pUVar8->fUnion).fStackFields.fLengthAndFlags;
  uVar10 = (uint)sVar2;
  uVar15 = uVar14;
  if (sVar2 < 0) {
    uVar11 = (pUVar8->fUnion).fFields.fLength;
  }
  else {
    uVar11 = (int)uVar10 >> 5;
  }
  goto LAB_0023f811;
}

Assistant:

int32_t
CollationRuleParser::parseString(int32_t i, UnicodeString &raw, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return i; }
    raw.remove();
    while(i < rules->length()) {
        UChar32 c = rules->charAt(i++);
        if(isSyntaxChar(c)) {
            if(c == 0x27) {  // apostrophe
                if(i < rules->length() && rules->charAt(i) == 0x27) {
                    // Double apostrophe, encodes a single one.
                    raw.append((UChar)0x27);
                    ++i;
                    continue;
                }
                // Quote literal text until the next single apostrophe.
                for(;;) {
                    if(i == rules->length()) {
                        setParseError("quoted literal text missing terminating apostrophe", errorCode);
                        return i;
                    }
                    c = rules->charAt(i++);
                    if(c == 0x27) {
                        if(i < rules->length() && rules->charAt(i) == 0x27) {
                            // Double apostrophe inside quoted literal text,
                            // still encodes a single apostrophe.
                            ++i;
                        } else {
                            break;
                        }
                    }
                    raw.append((UChar)c);
                }
            } else if(c == 0x5c) {  // backslash
                if(i == rules->length()) {
                    setParseError("backslash escape at the end of the rule string", errorCode);
                    return i;
                }
                c = rules->char32At(i);
                raw.append(c);
                i += U16_LENGTH(c);
            } else {
                // Any other syntax character terminates a string.
                --i;
                break;
            }
        } else if(PatternProps::isWhiteSpace(c)) {
            // Unquoted white space terminates a string.
            --i;
            break;
        } else {
            raw.append((UChar)c);
        }
    }
    for(int32_t j = 0; j < raw.length();) {
        UChar32 c = raw.char32At(j);
        if(U_IS_SURROGATE(c)) {
            setParseError("string contains an unpaired surrogate", errorCode);
            return i;
        }
        if(0xfffd <= c && c <= 0xffff) {
            setParseError("string contains U+FFFD, U+FFFE or U+FFFF", errorCode);
            return i;
        }
        j += U16_LENGTH(c);
    }
    return i;
}